

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O2

uint16_t FACTWaveBank_GetWaveIndex(FACTWaveBank *pWaveBank,char *szFriendlyName)

{
  int iVar1;
  uint16_t uVar2;
  
  uVar2 = 0xffff;
  if ((pWaveBank != (FACTWaveBank *)0x0) && (pWaveBank->waveBankNames != (char *)0x0)) {
    FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
    for (uVar2 = 0; (uint)uVar2 < pWaveBank->entryCount; uVar2 = uVar2 + 1) {
      iVar1 = SDL_strncmp(szFriendlyName,szFriendlyName,0x40);
      if (iVar1 == 0) goto LAB_0010bf39;
    }
    uVar2 = 0xffff;
LAB_0010bf39:
    FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
  }
  return uVar2;
}

Assistant:

uint16_t FACTWaveBank_GetWaveIndex(
	FACTWaveBank *pWaveBank,
	const char *szFriendlyName
) {
	uint16_t i;
	char *curName;
	if (pWaveBank == NULL || pWaveBank->waveBankNames == NULL)
	{
		return FACTINDEX_INVALID;
	}

	FAudio_PlatformLockMutex(pWaveBank->parentEngine->apiLock);
	curName = pWaveBank->waveBankNames;
	for (i = 0; i < pWaveBank->entryCount; i += 1, curName += 64)
	{
		if (FAudio_strncmp(szFriendlyName, curName, 64) == 0)
		{
			FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);
			return i;
		}
	}
	FAudio_PlatformUnlockMutex(pWaveBank->parentEngine->apiLock);

	return FACTINDEX_INVALID;
}